

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ED.cpp
# Opt level: O0

void __thiscall ED::ED(ED *this,ED *cpyObj)

{
  Mat local_1a8 [96];
  Mat local_148 [96];
  Mat local_e8 [112];
  Mat local_78 [96];
  ED *local_18;
  ED *cpyObj_local;
  ED *this_local;
  
  local_18 = cpyObj;
  cpyObj_local = this;
  std::
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  ::vector(&this->segmentPoints);
  cv::Mat::Mat(&this->smoothImage);
  cv::Mat::Mat(&this->srcImage);
  std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::vector(&this->anchorPoints);
  std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::vector(&this->edgePoints);
  cv::Mat::Mat(&this->edgeImage);
  cv::Mat::Mat(&this->gradImage);
  this->height = local_18->height;
  this->width = local_18->width;
  cv::Mat::clone();
  cv::Mat::operator=(&this->srcImage,local_78);
  cv::Mat::~Mat(local_78);
  this->op = local_18->op;
  this->gradThresh = local_18->gradThresh;
  this->anchorThresh = local_18->anchorThresh;
  this->scanInterval = local_18->scanInterval;
  this->minPathLen = local_18->minPathLen;
  this->sigma = local_18->sigma;
  this->sumFlag = (bool)(local_18->sumFlag & 1);
  cv::Mat::clone();
  cv::Mat::operator=(&this->edgeImage,local_e8);
  cv::Mat::~Mat(local_e8);
  cv::Mat::clone();
  cv::Mat::operator=(&this->smoothImage,local_148);
  cv::Mat::~Mat(local_148);
  cv::Mat::clone();
  cv::Mat::operator=(&this->gradImage,local_1a8);
  cv::Mat::~Mat(local_1a8);
  this->srcImg = *(uchar **)&this->field_0xb8;
  this->smoothImg = *(uchar **)&this->field_0x40;
  this->gradImg = *(short **)&this->field_0x1b0;
  this->edgeImg = *(uchar **)&this->field_0x150;
  std::
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  ::operator=(&this->segmentPoints,&local_18->segmentPoints);
  this->segmentNos = local_18->segmentNos;
  return;
}

Assistant:

ED::ED(const ED & cpyObj)
{
	height = cpyObj.height;
	width = cpyObj.width;

	srcImage = cpyObj.srcImage.clone();
	
	op = cpyObj.op;
	gradThresh = cpyObj.gradThresh;
	anchorThresh = cpyObj.anchorThresh;
	scanInterval = cpyObj.scanInterval;
	minPathLen = cpyObj.minPathLen;
	sigma = cpyObj.sigma;
	sumFlag = cpyObj.sumFlag;

	edgeImage = cpyObj.edgeImage.clone();
	smoothImage = cpyObj.smoothImage.clone();
	gradImage = cpyObj.gradImage.clone();

	srcImg = srcImage.data;

	smoothImg = smoothImage.data;
	gradImg = (short*)gradImage.data;
	edgeImg = edgeImage.data;

	segmentPoints = cpyObj.segmentPoints;
	segmentNos = cpyObj.segmentNos;
}